

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O1

CURLcode Curl_output_ntlm(Curl_easy *data,_Bool proxy)

{
  char *pcVar1;
  byte *pbVar2;
  connectdata *pcVar3;
  proxy_info *ppVar4;
  long lVar5;
  Curl_easy *pCVar6;
  CURLcode CVar7;
  uchar *puVar8;
  size_t sVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  uint uVar11;
  char *passwdp;
  char *pcVar12;
  char *pcVar13;
  char *base64;
  size_t len;
  bufref ntlmmsg;
  char *local_88;
  int local_7c;
  char *local_78;
  char *local_70;
  long local_68;
  ntlmdata *local_60;
  Curl_easy *local_58;
  size_t local_50;
  bufref local_48;
  
  local_88 = (char *)0x0;
  local_50 = 0;
  pcVar3 = data->conn;
  local_7c = (int)CONCAT71(in_register_00000031,proxy);
  uVar11 = local_7c << 5;
  pcVar12 = (data->set).str[(ulong)!proxy + 0x38];
  local_70 = "HTTP";
  if (pcVar12 != (char *)0x0) {
    local_70 = pcVar12;
  }
  ppVar4 = &pcVar3->http_proxy;
  local_68 = 0x12a8;
  if (local_7c != 0) {
    local_68 = 0x1290;
  }
  local_60 = &pcVar3->proxyntlm;
  uVar10 = CONCAT71(in_register_00000031,proxy) & 0xffffffff;
  if (local_7c == 0) {
    local_60 = &pcVar3->ntlm;
    ppVar4 = (proxy_info *)&pcVar3->host;
  }
  pcVar12 = *(char **)((long)&(data->state).aptr.user + (ulong)(uint)(local_7c << 4));
  passwdp = *(char **)((long)&(data->state).aptr.passwd + (ulong)(uint)(local_7c << 4));
  local_78 = (ppVar4->host).name;
  pbVar2 = &(data->state).authhost.field_0x18 + uVar11;
  *pbVar2 = *pbVar2 & 0xfe;
  if (pcVar12 == (char *)0x0) {
    pcVar12 = "";
  }
  pcVar1 = (char *)(uVar10 * 4 + 0x3f0);
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  local_58 = data;
  Curl_bufref_init(&local_48);
  pCVar6 = local_58;
  lVar5 = local_68;
  if (*(int *)((pcVar3->ntlm).nonce + uVar10 * 4 + -0xc) == 3) {
    pcVar13 = pcVar1 + (long)pcVar3;
    pcVar13[0] = '\x04';
    pcVar13[1] = '\0';
    pcVar13[2] = '\0';
    pcVar13[3] = '\0';
  }
  pcVar13 = (char *)((ulong)uVar11 | 0xdc0);
  if (*(int *)(pcVar1 + (long)pcVar3) == 2) {
    local_78 = pcVar1;
    local_70 = pcVar13;
    CVar7 = Curl_auth_create_ntlm_type3_message(local_58,pcVar12,passwdp,local_60,&local_48);
    if (CVar7 != CURLE_OK) goto LAB_0013cf99;
    sVar9 = Curl_bufref_len(&local_48);
    if (sVar9 != 0) {
      puVar8 = Curl_bufref_ptr(&local_48);
      sVar9 = Curl_bufref_len(&local_48);
      CVar7 = Curl_base64_encode((char *)puVar8,sVar9,&local_88,&local_50);
      lVar5 = local_68;
      if (CVar7 == CURLE_OK) {
        (*Curl_cfree)(*(void **)((long)&pCVar6->magic + local_68));
        pcVar12 = "";
        if ((char)local_7c != '\0') {
          pcVar12 = "Proxy-";
        }
        CVar7 = CURLE_OK;
        pcVar12 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar12,local_88);
        *(char **)((long)&pCVar6->magic + lVar5) = pcVar12;
        (*Curl_cfree)(local_88);
        if (*(long *)((long)&pCVar6->magic + lVar5) == 0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
        else {
          pcVar12 = local_78 + (long)(&pcVar3->chunk + -2) + 0x10;
          pcVar12[0] = '\x03';
          pcVar12[1] = '\0';
          pcVar12[2] = '\0';
          pcVar12[3] = '\0';
          pbVar2 = (byte *)((long)&pCVar6->conn + (long)local_70);
          *pbVar2 = *pbVar2 | 1;
        }
      }
      goto LAB_0013cf99;
    }
  }
  else {
    if (*(int *)(pcVar1 + (long)pcVar3) != 4) {
      CVar7 = Curl_auth_create_ntlm_type1_message
                        (local_58,pcVar12,passwdp,local_70,local_78,local_60,&local_48);
      if (CVar7 == CURLE_OK) {
        puVar8 = Curl_bufref_ptr(&local_48);
        sVar9 = Curl_bufref_len(&local_48);
        CVar7 = Curl_base64_encode((char *)puVar8,sVar9,&local_88,&local_50);
        lVar5 = local_68;
        if (CVar7 == CURLE_OK) {
          (*Curl_cfree)(*(void **)((long)&pCVar6->magic + local_68));
          pcVar12 = "";
          if ((char)local_7c != '\0') {
            pcVar12 = "Proxy-";
          }
          pcVar12 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar12,local_88);
          *(char **)((long)&pCVar6->magic + lVar5) = pcVar12;
          (*Curl_cfree)(local_88);
          CVar7 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&pCVar6->magic + lVar5) != 0) {
            CVar7 = CURLE_OK;
          }
        }
      }
      goto LAB_0013cf99;
    }
    (*Curl_cfree)(*(void **)((long)&local_58->magic + local_68));
    *(undefined8 *)((long)&pCVar6->magic + lVar5) = 0;
    pbVar2 = (byte *)((long)&pCVar6->conn + (long)pcVar13);
    *pbVar2 = *pbVar2 | 1;
  }
  CVar7 = CURLE_OK;
LAB_0013cf99:
  Curl_bufref_free(&local_48);
  return CVar7;
}

Assistant:

CURLcode Curl_output_ntlm(struct Curl_easy *data, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result = CURLE_OK;
  struct bufref ntlmmsg;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  struct auth *authp;
  struct connectdata *conn = data->conn;

  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  if(proxy) {
#ifndef CURL_DISABLE_PROXY
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    service = data->set.str[STRING_PROXY_SERVICE_NAME] ?
      data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    state = &conn->proxy_ntlm_state;
    authp = &data->state.authproxy;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  else {
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    service = data->set.str[STRING_SERVICE_NAME] ?
      data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    state = &conn->http_ntlm_state;
    authp = &data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(!s_hSecDll) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(!s_hSecDll)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  Curl_bufref_init(&ntlmmsg);

  /* connection is already authenticated, don't send a header in future
   * requests so go directly to NTLMSTATE_LAST */
  if(*state == NTLMSTATE_TYPE3)
    *state = NTLMSTATE_LAST;

  switch(*state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &ntlmmsg);
    if(!result) {
      DEBUGASSERT(Curl_bufref_len(&ntlmmsg) != 0);
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
      }
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(data, userp, passwdp,
                                                 ntlm, &ntlmmsg);
    if(!result && Curl_bufref_len(&ntlmmsg)) {
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
        else {
          *state = NTLMSTATE_TYPE3; /* we send a type-3 */
          authp->done = TRUE;
        }
      }
    }
    break;

  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }
  Curl_bufref_free(&ntlmmsg);

  return result;
}